

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

String * asl::Url::decode(String *__return_storage_ptr__,String *q0)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  ulong uVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  int iVar5;
  char b [3];
  undefined8 uStack_38;
  
  iVar5 = 0;
  (__return_storage_ptr__->field_2)._space[0] = '\0';
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_len = 0;
  uStack_38 = in_RAX & 0xffffffffffffff;
  iVar2 = q0->_len;
  if (0 < iVar2) {
    do {
      uVar3 = uStack_38;
      paVar4 = &q0->field_2;
      if (q0->_size != 0) {
        paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(q0->field_2)._str;
      }
      if (paVar4->_space[iVar5] == '%') {
        if (iVar2 + -2 < iVar5) {
          bVar1 = false;
        }
        else {
          uStack_38._7_1_ = SUB81(uVar3,7);
          uStack_38._0_7_ =
               CONCAT16(paVar4->_space[(long)iVar5 + 2],
                        CONCAT15(paVar4->_space[(long)iVar5 + 1],(undefined5)uStack_38));
          uVar3 = strtoul((char *)((long)&uStack_38 + 5),(char **)0x0,0x10);
          String::operator+=(__return_storage_ptr__,(char)uVar3);
          iVar5 = iVar5 + 2;
          bVar1 = true;
        }
      }
      else {
        bVar1 = true;
        String::operator+=(__return_storage_ptr__,paVar4->_space[iVar5]);
      }
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      iVar5 = iVar5 + 1;
      iVar2 = q0->_len;
    } while (iVar5 < iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String Url::decode(const String& q0)
{
	String q;
	char   b[3];
	b[2] = '\0';
	for (int i = 0; i < q0.length(); i++)
	{
		char c = q0[i];
		if (c == '%')
		{
			if (i > q0.length() - 2)
				break;
			b[0] = q0[i + 1];
			b[1] = q0[i + 2];
			q << (char)strtoul(b, NULL, 16);
			i += 2;
		}
		else
		q << c;
	}
#ifdef ASL_ANSI
	return utf8ToLocal(q);
#else
	return q;
#endif
}